

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)2>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  bool bVar1;
  
  bVar1 = bsim::quad_value_bit_vector::is_binary(lhs);
  if (((bVar1) && (bVar1 = bsim::quad_value_bit_vector::is_binary(rhs), bVar1)) &&
     (bVar1 = bsim::quad_value_bit_vector::equals(lhs,rhs), !bVar1)) {
    bVar1 = bsim::operator>(lhs,rhs);
    return !bVar1;
  }
  return false;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) < opCast( rhs );
        }